

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assigner.hpp
# Opt level: O2

void __thiscall
diy::DynamicAssigner::DynamicAssigner
          (DynamicAssigner *this,communicator *comm,int size__,int nblocks__)

{
  int iVar1;
  uint size;
  
  (this->super_Assigner).size_ = size__;
  (this->super_Assigner).nblocks_ = nblocks__;
  (this->super_Assigner)._vptr_Assigner = (_func_int **)&PTR__DynamicAssigner_00182e10;
  (this->comm_).comm_.data = (comm->comm_).data;
  iVar1 = comm->size_;
  (this->comm_).rank_ = comm->rank_;
  (this->comm_).size_ = iVar1;
  (this->comm_).owner_ = false;
  size = (nblocks__ / size__ + 1) - (uint)(nblocks__ % size__ == 0);
  this->div_ = size;
  mpi::window<int>::window(&this->rank_map_,&this->comm_,size);
  mpi::detail::lock_all(&(this->rank_map_).window_,1);
  return;
}

Assistant:

DynamicAssigner(const mpi::communicator& comm, int size__, int nblocks__):
                      Assigner(size__, nblocks__),
                      comm_(comm),
                      div_(nblocks__ / size__ + ((nblocks__ % size__) == 0 ? 0 : 1)),   // NB: same size window everywhere means the last rank may allocate extra space
                      rank_map_(comm_, div_)                                            { rank_map_.lock_all(mpi::nocheck); }